

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b3fcdf::X509Test_Expiry_Test::TestBody(X509Test_Expiry_Test *this)

{
  X509 *pXVar1;
  _Head_base<0UL,_x509_st_*,_false> _Var2;
  UniquePtr<X509> leaf_00;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long flags;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar5;
  char *pcVar6;
  char *in_R9;
  long lVar7;
  pointer *__ptr;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  initializer_list<x509_st_*> __l_11;
  initializer_list<x509_st_*> __l_12;
  initializer_list<x509_st_*> __l_13;
  initializer_list<x509_st_*> __l_14;
  initializer_list<x509_st_*> __l_15;
  initializer_list<x509_st_*> __l_16;
  initializer_list<x509_st_*> __l_17;
  initializer_list<x509_st_*> __l_18;
  initializer_list<x509_st_*> __l_19;
  initializer_list<x509_st_*> __l_20;
  initializer_list<x509_st_*> __l_21;
  initializer_list<x509_st_*> __l_22;
  initializer_list<x509_st_*> __l_23;
  initializer_list<x509_st_*> __l_24;
  initializer_list<x509_st_*> __l_25;
  bool partial_chain;
  ScopedTrace gtest_trace_4399;
  ScopedTrace gtest_trace_4397;
  bool check_time;
  int not_yet_valid;
  int has_expired;
  Certs leaf;
  Certs intermediate;
  Certs root;
  Certs root_cross;
  anon_class_8_1_610b4875 make_certs;
  UniquePtr<EVP_PKEY> key;
  anon_class_8_1_ba1d59bf make_cert;
  allocator_type local_321;
  AssertHelper local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  int local_310;
  bool local_309;
  string local_308;
  undefined1 local_2e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2e0;
  pointer local_2d8;
  _Head_base<0UL,_x509_st_*,_false> local_2d0;
  _Head_base<0UL,_x509_st_*,_false> local_2c8;
  int local_2c0;
  allocator_type local_2bc;
  ScopedTrace local_2bb;
  ScopedTrace local_2ba;
  bool local_2b9;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_2b8;
  int local_2a0;
  uint local_29c;
  undefined1 local_298 [8];
  _Head_base<0UL,_x509_st_*,_false> local_290;
  UniquePtr<X509> local_288;
  undefined1 local_280 [8];
  _Head_base<0UL,_x509_st_*,_false> local_278;
  UniquePtr<X509> local_270;
  char local_264 [4];
  undefined1 local_260 [8];
  _Head_base<0UL,_x509_st_*,_false> local_258;
  _Head_base<0UL,_x509_st_*,_false> local_250;
  undefined1 local_248 [8];
  _Head_base<0UL,_x509_st_*,_false> local_240;
  _Head_base<0UL,_x509_st_*,_false> local_238;
  anon_class_8_1_610b4875 local_230;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_228;
  long local_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  undefined8 uStack_180;
  _Any_data local_178;
  code *local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  anon_class_8_1_ba1d59bf local_38;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_b3fcdf *)&local_228,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_260[0] = (internal)
                 ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
                  local_228._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0);
  local_258._M_head_impl = (x509_st *)0x0;
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
      local_228._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    testing::Message::Message((Message *)local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_308,(internal *)local_260,(AssertionResult *)0x5e57b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10fb,local_308._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_248._1_7_,local_248[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_248._1_7_,local_248[0]) + 8))();
    }
    if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_258._M_head_impl !=
        (x509_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_258._M_head_impl);
    }
    goto LAB_003c5e08;
  }
  local_230.make_cert = &local_38;
  local_38.key = (UniquePtr<EVP_PKEY> *)&local_228;
  TestBody::anon_class_8_1_610b4875::operator()((Certs *)local_260,&local_230,"Root","Root",true);
  local_248[0] = (internal)(local_258._M_head_impl != (X509 *)0x0);
  local_240._M_head_impl = (x509_st *)0x0;
  if (local_258._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_308,(internal *)local_248,(AssertionResult *)"root.valid","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1124,local_308._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_280._1_7_,local_280[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_280._1_7_,local_280[0]) + 8))();
    }
    if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_240._M_head_impl !=
        (x509_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_240._M_head_impl);
    }
  }
  else {
    TestBody::anon_class_8_1_610b4875::operator()
              ((Certs *)local_248,&local_230,"Root 2","Root",true);
    local_280[0] = (internal)(local_240._M_head_impl != (x509_st *)0x0);
    local_278._M_head_impl = (x509_st *)0x0;
    if (local_240._M_head_impl == (x509_st *)0x0) {
      testing::Message::Message((Message *)local_298);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_308,(internal *)local_280,(AssertionResult *)"root_cross.valid","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_2e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1126,local_308._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_2e8,(Message *)local_298);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(local_298._1_7_,local_298[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_298._1_7_,local_298[0]) + 8))();
      }
      if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_278._M_head_impl !=
          (x509_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_278._M_head_impl);
      }
    }
    else {
      TestBody::anon_class_8_1_610b4875::operator()
                ((Certs *)local_280,&local_230,"Root","Intermediate",true);
      local_298[0] = (internal)(local_278._M_head_impl != (x509_st *)0x0);
      local_290._M_head_impl = (x509_st *)0x0;
      if (local_278._M_head_impl == (x509_st *)0x0) {
        testing::Message::Message((Message *)local_2e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_308,(internal *)local_298,(AssertionResult *)"intermediate.valid","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1128,local_308._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b8,(Message *)local_2e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if (local_2e8 != (undefined1  [8])0x0) {
          (*(code *)(*(x509_st **)local_2e8)->sig_alg)();
        }
        if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_290._M_head_impl !=
            (x509_st *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_290,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290._M_head_impl);
        }
      }
      else {
        TestBody::anon_class_8_1_610b4875::operator()
                  ((Certs *)local_298,&local_230,"Intermediate","Leaf",false);
        local_2e8[0] = local_290._M_head_impl != (X509 *)0x0;
        pbStack_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_290._M_head_impl == (X509 *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pbStack_2e0;
          testing::Message::Message((Message *)&local_2b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_308,(internal *)local_2e8,(AssertionResult *)"leaf.valid","false","true"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x112a,local_308._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
          }
          if (local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          local_318 = pbStack_2e0;
          if (pbStack_2e0 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_003c5d5b;
        }
        else {
          local_264[2] = '\x01';
          local_264[3] = '\0';
          lVar7 = 0;
          do {
            local_220 = lVar7;
            local_2b9 = (bool)local_264[lVar7 + 2];
            testing::ScopedTrace::ScopedTrace<bool>
                      (&local_2ba,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x112d,&local_2b9);
            local_264[0] = '\x01';
            local_264[1] = '\0';
            lVar7 = 0;
            do {
              local_309 = (bool)local_264[lVar7];
              testing::ScopedTrace::ScopedTrace<bool>
                        (&local_2bb,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x112f,&local_309);
              uVar4 = (ulong)(local_2b9 ^ 1) * 0x200000;
              flags = uVar4 + 0x80000;
              if (local_309 == false) {
                flags = uVar4;
              }
              local_2a0 = (uint)local_2b9 + (uint)local_2b9 * 8;
              local_29c = (uint)local_2b9;
              if (local_2b9 != false) {
                local_29c = 10;
              }
              pXVar1 = (X509 *)CONCAT71(local_298._1_7_,local_298[0]);
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l._M_len = 1;
              __l._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl = local_278._M_head_impl;
              __l_00._M_len = 1;
              __l_00._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_00,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_78._M_unused._M_object = (void *)0x0;
              local_78._8_8_ = 0;
              local_68 = (code *)0x0;
              uStack_60 = 0;
              local_2c0 = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_78)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"not_yet_valid",
                         "Verify(leaf.not_yet_valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                         ,&local_2a0,&local_2c0);
              if (local_68 != (code *)0x0) {
                (*local_68)(&local_78,&local_78,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar5 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x113e,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l_01._M_len = 1;
              __l_01._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_01,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl = (x509_st *)CONCAT71(local_280._1_7_,local_280[0]);
              __l_02._M_len = 1;
              __l_02._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_02,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_98._M_unused._M_object = (void *)0x0;
              local_98._8_8_ = 0;
              local_88 = (code *)0x0;
              uStack_80 = 0;
              local_2c0 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_98)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"not_yet_valid",
                         "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.not_yet_valid.get()}, {}, flags)"
                         ,&local_2a0,&local_2c0);
              if (local_88 != (code *)0x0) {
                (*local_88)(&local_98,&local_98,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1141,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              local_2c8._M_head_impl = (x509_st *)CONCAT71(local_260._1_7_,local_260[0]);
              __l_03._M_len = 1;
              __l_03._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_03,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl = local_278._M_head_impl;
              __l_04._M_len = 1;
              __l_04._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_04,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_b8._M_unused._M_object = (void *)0x0;
              local_b8._8_8_ = 0;
              local_a8 = (code *)0x0;
              uStack_a0 = 0;
              local_2c0 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_b8)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"not_yet_valid",
                         "Verify(leaf.valid.get(), {root.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                         ,&local_2a0,&local_2c0);
              if (local_a8 != (code *)0x0) {
                (*local_a8)(&local_b8,&local_b8,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1144,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              local_2c0 = 0;
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l_05._M_len = 1;
              __l_05._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_05,
                         &local_321);
              local_2d0._M_head_impl = local_278._M_head_impl;
              __l_06._M_len = 1;
              __l_06._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_06,
                         &local_2bc);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_d8._M_unused._M_object = (void *)0x0;
              local_d8._8_8_ = 0;
              local_c8 = (code *)0x0;
              uStack_c0 = 0;
              local_310 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_d8)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"0",
                         "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                         ,&local_2c0,&local_310);
              if (local_c8 != (code *)0x0) {
                (*local_c8)(&local_d8,&local_d8,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1147,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              leaf_00._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   local_288._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l_07._M_len = 1;
              __l_07._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_07,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl = local_278._M_head_impl;
              __l_08._M_len = 1;
              __l_08._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_08,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_f8._M_unused._M_object = (void *)0x0;
              local_f8._8_8_ = 0;
              local_e8 = (code *)0x0;
              uStack_e0 = 0;
              local_2c0 = Verify((X509 *)leaf_00._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_f8)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"has_expired",
                         "Verify(leaf.expired.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                         ,(int *)&local_29c,&local_2c0);
              if (local_e8 != (code *)0x0) {
                (*local_e8)(&local_f8,&local_f8,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x114a,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l_09._M_len = 1;
              __l_09._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_09,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl =
                   (x509_st *)
                   local_270._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_10._M_len = 1;
              __l_10._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_10,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_118._M_unused._M_object = (void *)0x0;
              local_118._8_8_ = 0;
              local_108 = (code *)0x0;
              uStack_100 = 0;
              local_2c0 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_118
                                );
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"has_expired",
                         "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.expired.get()}, {}, flags)"
                         ,(int *)&local_29c,&local_2c0);
              if (local_108 != (code *)0x0) {
                (*local_108)(&local_118,&local_118,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x114c,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              local_2c8._M_head_impl = local_250._M_head_impl;
              __l_11._M_len = 1;
              __l_11._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_11,
                         (allocator_type *)&local_310);
              local_2d0._M_head_impl = local_278._M_head_impl;
              __l_12._M_len = 1;
              __l_12._M_array = &local_2d0._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_12,
                         &local_321);
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_138._M_unused._M_object = (void *)0x0;
              local_138._8_8_ = 0;
              local_128 = (code *)0x0;
              uStack_120 = 0;
              local_2c0 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_138
                                );
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"has_expired",
                         "Verify(leaf.valid.get(), {root.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                         ,(int *)&local_29c,&local_2c0);
              if (local_128 != (code *)0x0) {
                (*local_128)(&local_138,&local_138,__destroy_functor);
              }
              if (local_2e8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x114e,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_290._M_head_impl;
              if (local_309 == false) {
                local_2c0 = 2;
                local_2c8._M_head_impl = local_240._M_head_impl;
                __l_19._M_len = 1;
                __l_19._M_array = &local_2c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_19,
                           &local_321);
                local_2d0._M_head_impl = local_278._M_head_impl;
                __l_20._M_len = 1;
                __l_20._M_array = &local_2d0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_20,
                           &local_2bc);
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_158._M_unused._M_object = (void *)0x0;
                local_158._8_8_ = 0;
                local_148 = (code *)0x0;
                uStack_140 = 0;
                local_310 = Verify(_Var2._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                   &local_2b8,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_158);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_320,"2",
                           "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&local_2c0,&local_310);
                if (local_148 != (code *)0x0) {
                  (*local_148)(&local_158,&local_158,__destroy_functor);
                }
                if (local_2e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity -
                                  (long)local_308._M_dataplus._M_p);
                }
                if (local_320.data_._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_308);
                  pcVar6 = "";
                  if (local_318 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = (local_318->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_2e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1154,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_2e8,(Message *)&local_308);
                  goto LAB_003c53d3;
                }
              }
              else {
                local_2c0 = 0;
                local_2c8._M_head_impl = local_240._M_head_impl;
                __l_13._M_len = 1;
                __l_13._M_array = &local_2c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_13,
                           &local_321);
                local_2d0._M_head_impl = local_278._M_head_impl;
                __l_14._M_len = 1;
                __l_14._M_array = &local_2d0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_14,
                           &local_2bc);
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_178._M_unused._M_object = (void *)0x0;
                local_178._8_8_ = 0;
                local_168 = (code *)0x0;
                uStack_160 = 0;
                local_310 = Verify(_Var2._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                   &local_2b8,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_178);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_320,"0",
                           "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&local_2c0,&local_310);
                if (local_168 != (code *)0x0) {
                  (*local_168)(&local_178,&local_178,__destroy_functor);
                }
                if (local_2e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity -
                                  (long)local_308._M_dataplus._M_p);
                }
                if (local_320.data_._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_308);
                  pcVar6 = "";
                  if (local_318 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = (local_318->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_2e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1158,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_2e8,(Message *)&local_308);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                  }
                }
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_318,local_318);
                }
                _Var2._M_head_impl = local_290._M_head_impl;
                local_2c8._M_head_impl = (x509_st *)CONCAT71(local_248._1_7_,local_248[0]);
                __l_15._M_len = 1;
                __l_15._M_array = &local_2c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_15,
                           (allocator_type *)&local_310);
                local_2d0._M_head_impl = local_278._M_head_impl;
                __l_16._M_len = 1;
                __l_16._M_array = &local_2d0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_16,
                           &local_321);
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_198._M_unused._M_object = (void *)0x0;
                local_198._8_8_ = 0;
                local_188 = (code *)0x0;
                uStack_180 = 0;
                local_2c0 = Verify(_Var2._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                   &local_2b8,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_198);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_320,"not_yet_valid",
                           "Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&local_2a0,&local_2c0);
                if (local_188 != (code *)0x0) {
                  (*local_188)(&local_198,&local_198,__destroy_functor);
                }
                if (local_2e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity -
                                  (long)local_308._M_dataplus._M_p);
                }
                if (local_320.data_._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_308);
                  pcVar6 = "";
                  if (local_318 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = (local_318->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_2e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x115c,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_2e8,(Message *)&local_308);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                  }
                }
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_318,local_318);
                }
                _Var2._M_head_impl = local_290._M_head_impl;
                local_2c8._M_head_impl = local_238._M_head_impl;
                __l_17._M_len = 1;
                __l_17._M_array = &local_2c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_17,
                           (allocator_type *)&local_310);
                local_2d0._M_head_impl = local_278._M_head_impl;
                __l_18._M_len = 1;
                __l_18._M_array = &local_2d0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_18,
                           &local_321);
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_1b8._M_unused._M_object = (void *)0x0;
                local_1b8._8_8_ = 0;
                local_1a8 = (code *)0x0;
                uStack_1a0 = 0;
                local_2c0 = Verify(_Var2._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                   &local_2b8,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_1b8);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_320,"has_expired",
                           "Verify(leaf.valid.get(), {root_cross.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,(int *)&local_29c,&local_2c0);
                if (local_1a8 != (code *)0x0) {
                  (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
                }
                if (local_2e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity -
                                  (long)local_308._M_dataplus._M_p);
                }
                if (local_320.data_._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_308);
                  pcVar6 = "";
                  if (local_318 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = (local_318->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_2e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x115f,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_2e8,(Message *)&local_308);
LAB_003c53d3:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                  }
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_258._M_head_impl;
              local_2d0._M_head_impl = local_2d0._M_head_impl & 0xffffffff00000000;
              local_2c8._M_head_impl = local_258._M_head_impl;
              __l_21._M_len = 1;
              __l_21._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_21,
                         (allocator_type *)&local_310);
              local_2e8 = (undefined1  [8])0x0;
              pbStack_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_2d8 = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1d8._M_unused._M_object = (void *)0x0;
              local_1d8._8_8_ = 0;
              local_1c8 = (code *)0x0;
              uStack_1c0 = 0;
              local_2c0 = Verify(_Var2._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,
                                 &local_2b8,flags,(function<void_(x509_store_ctx_st_*)> *)&local_1d8
                                );
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"0",
                         "Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags)",
                         (int *)&local_2d0,&local_2c0);
              if (local_1c8 != (code *)0x0) {
                (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1165,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              pXVar1 = (X509 *)CONCAT71(local_260._1_7_,local_260[0]);
              __l_22._M_len = 1;
              __l_22._M_array = &local_2c8._M_head_impl;
              local_2c8._M_head_impl = pXVar1;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_22,
                         (allocator_type *)&local_2c0);
              local_2e8 = (undefined1  [8])0x0;
              pbStack_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_2d8 = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1f8._M_unused._M_object = (void *)0x0;
              local_1f8._8_8_ = 0;
              local_1e8 = (code *)0x0;
              uStack_1e0 = 0;
              iVar3 = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                             (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,&local_2b8,
                             flags,(function<void_(x509_store_ctx_st_*)> *)&local_1f8);
              local_2d0._M_head_impl._0_4_ = iVar3;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"not_yet_valid",
                         "Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {}, {}, flags)"
                         ,&local_2a0,(int *)&local_2d0);
              if (local_1e8 != (code *)0x0) {
                (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1168,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              _Var2._M_head_impl = local_250._M_head_impl;
              local_2c8._M_head_impl = local_250._M_head_impl;
              __l_23._M_len = 1;
              __l_23._M_array = &local_2c8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_23,
                         (allocator_type *)&local_2c0);
              local_2e8 = (undefined1  [8])0x0;
              pbStack_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              local_2d8 = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = 0;
              local_208 = (code *)0x0;
              uStack_200 = 0;
              iVar3 = Verify(_Var2._M_head_impl,
                             (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                             (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,&local_2b8,
                             flags,(function<void_(x509_store_ctx_st_*)> *)&local_218);
              local_2d0._M_head_impl._0_4_ = iVar3;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_320,"has_expired",
                         "Verify(root.expired.get(), {root.expired.get()}, {}, {}, flags)",
                         (int *)&local_29c,(int *)&local_2d0);
              if (local_208 != (code *)0x0) {
                (*local_208)(&local_218,&local_218,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity -
                                (long)local_308._M_dataplus._M_p);
              }
              if (local_320.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_308);
                pcVar6 = "";
                if (local_318 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_318->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_2e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x116a,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_2e8,(Message *)&local_308);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
                }
              }
              if (local_318 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_318,local_318);
              }
              testing::ScopedTrace::~ScopedTrace(&local_2bb);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 2);
            testing::ScopedTrace::~ScopedTrace(&local_2ba);
            _Var2._M_head_impl = local_290._M_head_impl;
            lVar7 = local_220 + 1;
          } while (lVar7 != 2);
          local_2a0 = 10;
          local_2c8._M_head_impl = local_258._M_head_impl;
          __l_24._M_len = 1;
          __l_24._M_array = &local_2c8._M_head_impl;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                    ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,__l_24,
                     (allocator_type *)&local_2c0);
          local_2d0._M_head_impl = local_278._M_head_impl;
          __l_25._M_len = 1;
          __l_25._M_array = &local_2d0._M_head_impl;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                    ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,__l_25,
                     (allocator_type *)&local_310);
          local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_58._M_unused._M_object = (void *)0x0;
          local_58._8_8_ = 0;
          local_40 = std::
                     _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4465:3)>
                     ::_M_invoke;
          local_48 = std::
                     _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4465:3)>
                     ::_M_manager;
          local_29c = Verify(_Var2._M_head_impl,
                             (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_308,
                             (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_2e8,&local_2b8,0
                             ,(function<void_(x509_store_ctx_st_*)> *)&local_58);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_320,"10",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x2); })"
                     ,&local_2a0,(int *)&local_29c);
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          if (local_2e8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_308._M_dataplus._M_p,
                            local_308.field_2._M_allocated_capacity -
                            (long)local_308._M_dataplus._M_p);
          }
          if (local_320.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_308);
            if (local_318 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = (local_318->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_2e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1177,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_2e8,(Message *)&local_308);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_308._M_dataplus._M_p + 8))();
            }
          }
          if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_318;
LAB_003c5d5b:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(this_00,local_318);
          }
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_288);
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_290);
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_298);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_270);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_278);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_280);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_238);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_240);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_248);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_250);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_258);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_260);
LAB_003c5e08:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_228);
  return;
}

Assistant:

TEST(X509Test, Expiry) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  auto make_cert = [&](const char *issuer, const char *subject, bool is_ca,
                       int not_before_offset,
                       int not_after_offset) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer, subject, key.get(), is_ca);
    if (cert == nullptr ||
        !ASN1_TIME_adj(X509_getm_notBefore(cert.get()), kReferenceTime,
                       /*offset_day=*/not_before_offset,
                       /*offset_sec=*/0) ||
        !ASN1_TIME_adj(X509_getm_notAfter(cert.get()), kReferenceTime,
                       /*offset_day=*/not_after_offset,
                       /*offset_sec=*/0) ||
        !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  struct Certs {
    bssl::UniquePtr<X509> not_yet_valid, valid, expired;
  };
  auto make_certs = [&](const char *issuer, const char *subject,
                        bool is_ca) -> Certs {
    Certs certs;
    certs.not_yet_valid =
        make_cert(issuer, subject, is_ca, /*not_before_offset=*/1,
                  /*not_after_offset=*/2);
    certs.valid = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-1,
                            /*not_after_offset=*/1);
    certs.expired = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-2,
                              /*not_after_offset=*/-1);
    if (certs.not_yet_valid == nullptr || certs.valid == nullptr ||
        certs.expired == nullptr) {
      return Certs{};
    }
    return certs;
  };

  Certs root = make_certs("Root", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root.valid);
  Certs root_cross = make_certs("Root 2", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root_cross.valid);
  Certs intermediate = make_certs("Root", "Intermediate", /*is_ca=*/true);
  ASSERT_TRUE(intermediate.valid);
  Certs leaf = make_certs("Intermediate", "Leaf", /*is_ca=*/false);
  ASSERT_TRUE(leaf.valid);

  for (bool check_time : {true, false}) {
    SCOPED_TRACE(check_time);
    for (bool partial_chain : {true, false}) {
      SCOPED_TRACE(partial_chain);
      unsigned long flags = 0;
      if (!check_time) {
        flags |= X509_V_FLAG_NO_CHECK_TIME;
      }
      if (partial_chain) {
        flags |= X509_V_FLAG_PARTIAL_CHAIN;
      }

      int not_yet_valid =
          check_time ? X509_V_ERR_CERT_NOT_YET_VALID : X509_V_OK;
      int has_expired = check_time ? X509_V_ERR_CERT_HAS_EXPIRED : X509_V_OK;

      EXPECT_EQ(not_yet_valid,
                Verify(leaf.not_yet_valid.get(), {root.valid.get()},
                       {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.valid.get()},
                       {intermediate.not_yet_valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.not_yet_valid.get()},
                       {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.valid.get()},
                                  {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(has_expired, Verify(leaf.expired.get(), {root.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.valid.get()},
                                    {intermediate.expired.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.expired.get()},
                                    {intermediate.valid.get()}, {}, flags));

      if (!partial_chain) {
        // By default, non-self-signed certificates are not valid trust anchors.
        EXPECT_EQ(X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT,
                  Verify(leaf.valid.get(), {root_cross.valid.get()},
                         {intermediate.valid.get()}, {}, flags));
      } else {
        // |X509_V_FLAG_PARTIAL_CHAIN| allows non-self-signed trust anchors.
        EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root_cross.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
        // Expiry of the trust anchor must still be checked.
        EXPECT_EQ(not_yet_valid,
                  Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()},
                         {intermediate.valid.get()}, {}, flags));
        EXPECT_EQ(has_expired,
                  Verify(leaf.valid.get(), {root_cross.expired.get()},
                         {intermediate.valid.get()}, {}, flags));
      }

      // When the trust anchor is the target certificate, expiry should also be
      // checked.
      EXPECT_EQ(X509_V_OK,
                Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {},
                       {}, flags));
      EXPECT_EQ(has_expired, Verify(root.expired.get(), {root.expired.get()},
                                    {}, {}, flags));
    }
  }

  // X509_V_FLAG_USE_CHECK_TIME is an internal flag, but one caller relies on
  // being able to clear it to restore the system time. Using the system time,
  // all certificates in this test should read as expired.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_USE_CHECK_TIME);
                   }));
}